

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void ps_astar_finish(ps_astar_t *nbest)

{
  glist_t local_18;
  gnode_t *gn;
  ps_astar_t *nbest_local;
  
  for (local_18 = nbest->hyps; local_18 != (glist_t)0x0; local_18 = local_18->next) {
    ckd_free((local_18->data).ptr);
  }
  glist_free(nbest->hyps);
  listelem_alloc_free(nbest->latpath_alloc);
  ckd_free(nbest);
  return;
}

Assistant:

void
ps_astar_finish(ps_astar_t *nbest)
{
    gnode_t *gn;

    /* Free all hyps. */
    for (gn = nbest->hyps; gn; gn = gnode_next(gn)) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(nbest->hyps);
    /* Free all paths. */
    listelem_alloc_free(nbest->latpath_alloc);
    /* Free the Henge. */
    ckd_free(nbest);
}